

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 03_signal_epoll.c
# Opt level: O0

int main(int argc,char **argv)

{
  int local_1c;
  int n;
  char **argv_local;
  int argc_local;
  
  setup_signals(argc,argv);
  setup_epoll();
  add_fd_to_epoll(0);
  listen_sock = setup_listening_socket(5000);
  add_fd_to_epoll(listen_sock);
  do {
    nfds = epoll_wait(epollfd,(epoll_event *)events,10,-1);
    if (nfds == -1) {
      perror("epoll_wait()");
      exit(1);
    }
    for (local_1c = 0; local_1c < nfds; local_1c = local_1c + 1) {
      if (events[local_1c].data.fd == 0) {
        printf("stdin ready..\n");
        copy_fd(0,1);
      }
      else if (events[local_1c].data.fd == conn_sock) {
        printf("socket data ready..\n");
        copy_fd(conn_sock,conn_sock);
      }
      else if (events[local_1c].data.fd == listen_sock) {
        printf("new connection ready..\n");
        conn_sock = accept(listen_sock,(sockaddr *)0x0,(socklen_t *)0x0);
        if (conn_sock == -1) {
          perror("accept()");
          exit(1);
        }
        add_fd_to_epoll(conn_sock);
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
    /* Setup sigalrm if a number is passed as the first argument */
    setup_signals(argc, argv);
    /* Let's setup epoll */
    setup_epoll();
    /* Add stdin-based echo server to epoll's monitoring list */
    add_fd_to_epoll(STDIN_FILENO);
    /* Setup a socket to listen on port 5000 */
    listen_sock = setup_listening_socket(5000);
    /* Add socket-based echo server to epoll's monitoring list */
    add_fd_to_epoll(listen_sock);

    while(1) {
        /* Let's wait for some activity on either stdin or on the socket */
        nfds = epoll_wait(epollfd, events, MAX_EVENTS, -1);
        if (nfds == -1)
            handle_error("epoll_wait()");

        /*
         * For each of the file descriptors epoll says are ready,
         * check which one it is the echo read data back.
         * */
        for (int n = 0; n < nfds; n++) {
            if ( events[n].data.fd == STDIN_FILENO ) {
                printf("stdin ready..\n");
                copy_fd(STDIN_FILENO, STDOUT_FILENO);
            } else if ( events[n].data.fd == conn_sock ) {
                printf("socket data ready..\n");
                copy_fd(conn_sock, conn_sock);
            } else if (events[n].data.fd == listen_sock) {
                /* Listening socket is ready, meaning
                 * there's a new client connection */
                printf("new connection ready..\n");
                conn_sock = accept(listen_sock, NULL, NULL);
                if (conn_sock == -1 )
                    handle_error("accept()");
                /* Add the connected client to epoll's monitored FDs list */
                add_fd_to_epoll(conn_sock);
            }
        }
    }
    return 0;
}